

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

char * __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  ostream *poVar4;
  cmake *this_01;
  PolicyID id;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  if ((WARN < this->Policy54Status) &&
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), bVar1)) {
    return (char *)0x0;
  }
  this_00 = this->Makefile;
  psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
  pcVar3 = cmMakefile::GetDefinition(this_00,psVar2);
  if ((((pcVar3 != (char *)0x0) && (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), bVar1))
      && (this->Policy54Status == WARN)) &&
     (bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext),
     !bVar1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1b8,(cmPolicies *)0x36,id);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Quoted variables like \"",0x17);
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
               ,0x7b);
    this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1b8,&this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return pcVar3;
}

Assistant:

const char* cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return CM_NULLPTR;
  }

  const char* def = this->Makefile.GetDefinition(argument.GetValue());

  if (def && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(
          this->ExecutionContext)) {
      std::ostringstream e;
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)) << "\n";
      e << "Quoted variables like \"" << argument.GetValue()
        << "\" will no longer be dereferenced "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()->IssueMessage(
        cmake::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return def;
}